

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O1

void X86_init(MCRegisterInfo *MRI)

{
  uint16_t *in_RAX;
  uint unaff_retaddr;
  uint16_t *in_stack_00000008;
  
  MCRegisterInfo_InitMCRegisterInfo
            (MRI,X86RegDesc,0xea,0,0,X86MCRegisterClasses,0x330010,(uint16_t (*) [2])0x0,0x330150,
             (MCPhysReg *)0x7,(char *)0x0,in_RAX,unaff_retaddr,in_stack_00000008);
  return;
}

Assistant:

void X86_init(MCRegisterInfo *MRI)
{
	/*
	   InitMCRegisterInfo(X86RegDesc, 234,
	   RA, PC,
	   X86MCRegisterClasses, 79,
	   X86RegUnitRoots, 119, X86RegDiffLists, X86RegStrings,
	   X86SubRegIdxLists, 7,
	   X86SubRegIdxRanges, X86RegEncodingTable);
	*/

	MCRegisterInfo_InitMCRegisterInfo(MRI, X86RegDesc, 234,
			0, 0,
			X86MCRegisterClasses, 79,
			0, 0, X86RegDiffLists, 0,
			X86SubRegIdxLists, 7,
			0);
}